

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemmodeltester.cpp
# Opt level: O2

void __thiscall
QAbstractItemModelTesterPrivate::layoutAboutToBeChanged(QAbstractItemModelTesterPrivate *this)

{
  QObject *pQVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  long in_FS_OFFSET;
  undefined8 local_70;
  undefined8 local_68;
  undefined8 uStack_60;
  QPersistentModelIndex local_58;
  QModelIndex local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_50._0_8_ = local_50._0_8_ & 0xffffffff00000000;
  bVar2 = compare<QAbstractItemModelTesterPrivate::ChangeInFlight,QAbstractItemModelTesterPrivate::ChangeInFlight>
                    (this,&this->changeInFlight,(ChangeInFlight *)&local_50,"changeInFlight",
                     "ChangeInFlight::None",
                     "/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/testlib/qabstractitemmodeltester.cpp"
                     ,0x38a);
  if (bVar2) {
    this->changeInFlight = LayoutChanged;
    iVar4 = 0;
    while( true ) {
      pQVar1 = (this->model).wp.value;
      local_50.r = -1;
      local_50.c = -1;
      local_50.i = 0;
      local_50.m.ptr = (QAbstractItemModel *)0x0;
      iVar3 = (**(code **)(*(long *)pQVar1 + 0x78))(pQVar1,&local_50);
      if (99 < iVar3) {
        iVar3 = 100;
      }
      if (iVar3 <= iVar4) break;
      pQVar1 = (this->model).wp.value;
      local_70 = 0xffffffffffffffff;
      local_68 = 0;
      uStack_60 = 0;
      (**(code **)(*(long *)pQVar1 + 0x60))(&local_50,pQVar1,iVar4,0,&local_70);
      QPersistentModelIndex::QPersistentModelIndex(&local_58,&local_50);
      QList<QPersistentModelIndex>::emplaceBack<QPersistentModelIndex>(&this->changing,&local_58);
      QPersistentModelIndex::~QPersistentModelIndex(&local_58);
      iVar4 = iVar4 + 1;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QAbstractItemModelTesterPrivate::layoutAboutToBeChanged()
{
    MODELTESTER_COMPARE(changeInFlight, ChangeInFlight::None);
    changeInFlight = ChangeInFlight::LayoutChanged;

    for (int i = 0; i < qBound(0, model->rowCount(), 100); ++i)
        changing.append(QPersistentModelIndex(model->index(i, 0)));
}